

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_matrix.cpp
# Opt level: O3

Reals __thiscall Omega_h::matrices_times_matrices_dim<2>(Omega_h *this,Reals *a,Reals *b)

{
  int *piVar1;
  Alloc *pAVar2;
  ulong uVar3;
  undefined8 uVar4;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *pvVar5;
  char *pcVar6;
  char *pcVar7;
  int size_in;
  size_t sVar8;
  Reals RVar9;
  Write<double> out;
  type f;
  Write<double> local_78;
  Write<double> local_68;
  type local_58;
  
  pAVar2 = (a->write_).shared_alloc_.alloc;
  if (((ulong)pAVar2 & 1) == 0) {
    sVar8 = pAVar2->size;
  }
  else {
    sVar8 = (ulong)pAVar2 >> 3;
  }
  if ((sVar8 >> 3 & 3) == 0) {
    pAVar2 = (b->write_).shared_alloc_.alloc;
    if (((ulong)pAVar2 & 1) == 0) {
      uVar3 = pAVar2->size;
    }
    else {
      uVar3 = (ulong)pAVar2 >> 3;
    }
    size_in = (int)(sVar8 >> 3);
    if ((int)(uVar3 >> 3) == size_in) {
      local_58.out.shared_alloc_.alloc = (Alloc *)&local_58.a;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"");
      Write<double>::Write(&local_78,size_in,(string *)&local_58);
      if (local_58.out.shared_alloc_.alloc != (Alloc *)&local_58.a) {
        operator_delete(local_58.out.shared_alloc_.alloc,
                        (ulong)((long)&(local_58.a.write_.shared_alloc_.alloc)->size + 1));
      }
      local_58.out.shared_alloc_.alloc = local_78.shared_alloc_.alloc;
      if (((ulong)local_78.shared_alloc_.alloc & 7) == 0 &&
          local_78.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_58.out.shared_alloc_.alloc = (Alloc *)((local_78.shared_alloc_.alloc)->size * 8 + 1)
          ;
        }
        else {
          (local_78.shared_alloc_.alloc)->use_count = (local_78.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_58.out.shared_alloc_.direct_ptr = local_78.shared_alloc_.direct_ptr;
      local_58.a.write_.shared_alloc_.alloc = (a->write_).shared_alloc_.alloc;
      if (((ulong)local_58.a.write_.shared_alloc_.alloc & 7) == 0 &&
          local_58.a.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_58.a.write_.shared_alloc_.alloc =
               (Alloc *)((local_58.a.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_58.a.write_.shared_alloc_.alloc)->use_count =
               (local_58.a.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_58.a.write_.shared_alloc_.direct_ptr = (a->write_).shared_alloc_.direct_ptr;
      local_58.b.write_.shared_alloc_.alloc = (b->write_).shared_alloc_.alloc;
      if (((ulong)local_58.b.write_.shared_alloc_.alloc & 7) == 0 &&
          local_58.b.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_58.b.write_.shared_alloc_.alloc =
               (Alloc *)((local_58.b.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_58.b.write_.shared_alloc_.alloc)->use_count =
               (local_58.b.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_58.b.write_.shared_alloc_.direct_ptr = (b->write_).shared_alloc_.direct_ptr;
      parallel_for<Omega_h::matrices_times_matrices_dim<2>(Omega_h::Read<double>,Omega_h::Read<double>)::_lambda(int)_1_>
                (size_in >> 2,&local_58,"matrices_times_matrices");
      local_68.shared_alloc_.alloc = local_78.shared_alloc_.alloc;
      local_68.shared_alloc_.direct_ptr = local_78.shared_alloc_.direct_ptr;
      if ((((ulong)local_78.shared_alloc_.alloc & 7) == 0 &&
           local_78.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
        (local_78.shared_alloc_.alloc)->use_count = (local_78.shared_alloc_.alloc)->use_count + -1;
        local_68.shared_alloc_.alloc = (Alloc *)((local_78.shared_alloc_.alloc)->size * 8 + 1);
      }
      local_78.shared_alloc_.alloc = (Alloc *)0x0;
      local_78.shared_alloc_.direct_ptr = (void *)0x0;
      Read<double>::Read((Read<signed_char> *)this,&local_68);
      pAVar2 = local_68.shared_alloc_.alloc;
      if (((ulong)local_68.shared_alloc_.alloc & 7) == 0 &&
          local_68.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_68.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_68.shared_alloc_.alloc);
          operator_delete(pAVar2,0x48);
        }
      }
      matrices_times_matrices_dim<2>(Omega_h::Read<double>,Omega_h::Read<double>)::{lambda(int)#1}::
      ~Read((_lambda_int__1_ *)&local_58);
      pAVar2 = local_78.shared_alloc_.alloc;
      pvVar5 = extraout_RDX;
      if (((ulong)local_78.shared_alloc_.alloc & 7) == 0 &&
          local_78.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_78.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_78.shared_alloc_.alloc);
          operator_delete(pAVar2,0x48);
          pvVar5 = extraout_RDX_00;
        }
      }
      RVar9.write_.shared_alloc_.direct_ptr = pvVar5;
      RVar9.write_.shared_alloc_.alloc = (Alloc *)this;
      return (Reals)RVar9.write_.shared_alloc_;
    }
    pcVar7 = "b.size() == n * matrix_ncomps(dim, dim)";
    pcVar6 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_matrix.cpp"
    ;
    uVar4 = 0x48;
  }
  else {
    pcVar7 = "a % b == 0";
    pcVar6 = 
    "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_scalar.hpp"
    ;
    uVar4 = 0x11a;
  }
  fail("assertion %s failed at %s +%d\n",pcVar7,pcVar6,uVar4);
}

Assistant:

Reals matrices_times_matrices_dim(Reals a, Reals b) {
  auto n = divide_no_remainder(a.size(), matrix_ncomps(dim, dim));
  OMEGA_H_CHECK(b.size() == n * matrix_ncomps(dim, dim));
  auto out = Write<Real>(n * matrix_ncomps(dim, dim));
  auto f = OMEGA_H_LAMBDA(LO i) {
    set_matrix(out, i, get_matrix<dim, dim>(a, i) * get_matrix<dim, dim>(b, i));
  };
  parallel_for(n, f, "matrices_times_matrices");
  return out;
}